

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginalTrek++.cpp
# Opt level: O1

void __thiscall IsoSpec::Marginal::Marginal(Marginal *this,Marginal *other)

{
  double *pdVar1;
  uint uVar2;
  
  this->_vptr_Marginal = (_func_int **)&PTR__Marginal_0012bae0;
  this->disowned = other->disowned;
  uVar2 = other->atomCnt;
  this->isotopeNo = other->isotopeNo;
  this->atomCnt = uVar2;
  pdVar1 = other->atom_masses;
  this->atom_lProbs = other->atom_lProbs;
  this->atom_masses = pdVar1;
  this->loggamma_nominator = other->loggamma_nominator;
  other->disowned = true;
  if (other->mode_conf != (Conf)0x0) {
    this->mode_conf = other->mode_conf;
    this->mode_lprob = other->mode_lprob;
    return;
  }
  this->mode_conf = (Conf)0x0;
  return;
}

Assistant:

Marginal::Marginal(Marginal&& other) :
disowned(other.disowned),
isotopeNo(other.isotopeNo),
atomCnt(other.atomCnt),
atom_lProbs(other.atom_lProbs),
atom_masses(other.atom_masses),
loggamma_nominator(other.loggamma_nominator)
{
    other.disowned = true;
    if(other.mode_conf == nullptr)
    {
        mode_conf = nullptr;
        // Deliberately not initializing mode_lprob. In this state other.mode_lprob is uninitialized too.
    }
    else
    {
        mode_conf = other.mode_conf;
        mode_lprob = other.mode_lprob;
    }
}